

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall test_cpp_db_sqlite::test_execute::~test_execute(test_execute *this)

{
  test_execute *this_local;
  
  SQLiteTestFixture::~SQLiteTestFixture(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_execute)
{
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 3);
    cpp_db::result r = cpp_db::execute(*con, "select * from TEST_TABLE where COL1 in (?, ?)", 1, 2);
    int64_t sum = 0;
    std::string names;
    while(!r.is_eof())
    {
        sum += cpp_db::value_of<int64_t>(r.get_column_value(0));
        names.append(cpp_db::value_of<std::string>(r.get_column_value(1)));
        r.move_next();
    }
    BOOST_CHECK_EQUAL(sum, 3);
    BOOST_CHECK_EQUAL(names, "firstsecond");

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)", 1, 2, "first", "second")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE where COL1 = ?", 1));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE"));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 0);
}